

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::null_scoped_padder>::format
          (source_location_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_3,memory_buf_t *dest)

{
  bool bVar1;
  uint uVar2;
  memory_buf_t *in_RCX;
  long in_RSI;
  buffer<char> *in_RDI;
  null_scoped_padder p;
  size_t text_size;
  char *in_stack_ffffffffffffffa8;
  memory_buf_t *in_stack_ffffffffffffffc0;
  string_view_t in_stack_ffffffffffffffc8;
  memory_buf_t *dest_00;
  int n;
  
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (!bVar1) {
    bVar1 = padding_info::enabled((padding_info *)&in_RDI->ptr_);
    if (bVar1) {
      in_stack_ffffffffffffffa8 = (char *)std::char_traits<char>::length((char_type *)0x1d902d);
      uVar2 = null_scoped_padder::count_digits<int>(*(int *)(in_RSI + 0x40));
      dest_00 = (memory_buf_t *)(in_stack_ffffffffffffffa8 + (ulong)uVar2 + 1);
    }
    else {
      dest_00 = (memory_buf_t *)0x0;
    }
    null_scoped_padder::null_scoped_padder
              ((null_scoped_padder *)&stack0xffffffffffffffd7,(size_t)dest_00,
               (padding_info *)&in_RDI->ptr_,in_RCX);
    n = (int)((ulong)in_RCX >> 0x20);
    ::fmt::v6::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)in_RDI,in_stack_ffffffffffffffa8);
    fmt_helper::append_string_view(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    ::fmt::v6::internal::buffer<char>::push_back(in_RDI,in_stack_ffffffffffffffa8);
    fmt_helper::append_int<int>(n,dest_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }

        size_t text_size;
        if (padinfo_.enabled())
        {
            // calc text size for padding based on "filename:line"
            text_size = std::char_traits<char>::length(msg.source.filename) + ScopedPadder::count_digits(msg.source.line) + 1;
        }
        else
        {
            text_size = 0;
        }

        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
        dest.push_back(':');
        fmt_helper::append_int(msg.source.line, dest);
    }